

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diagnostics.cc
# Opt level: O0

void __thiscall flow::diagnostics::ConsoleReport::push_back(ConsoleReport *this,Message *message)

{
  string_view local_88;
  string local_78;
  string_view local_48;
  string local_38;
  Message *local_18;
  Message *message_local;
  ConsoleReport *this_local;
  
  if (message->type != Warning) {
    this->errorCount_ = this->errorCount_ + 1;
  }
  local_18 = message;
  message_local = (Message *)this;
  if (message->type == Warning) {
    fmt::v5::basic_string_view<char>::basic_string_view(&local_48,"Warning: {}\n");
    fmt::v5::format<flow::diagnostics::Message>(&local_38,local_48,message);
    std::operator<<((ostream *)&std::cerr,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    fmt::v5::basic_string_view<char>::basic_string_view(&local_88,"Error: {}\n");
    fmt::v5::format<flow::diagnostics::Message>(&local_78,local_88,message);
    std::operator<<((ostream *)&std::cerr,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  return;
}

Assistant:

void ConsoleReport::push_back(Message message) {
  if (message.type != Type::Warning)
    errorCount_++;

  switch (message.type) {
    case Type::Warning:
      std::cerr << fmt::format("Warning: {}\n", message);
      break;
    default:
      std::cerr << fmt::format("Error: {}\n", message);
      break;
  }
}